

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::json_abi_v3_11_3::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  uint in_ESI;
  undefined1 *in_RDI;
  uint32_t k;
  uint local_c;
  char *local_8;
  
  if ((int)in_ESI < -999) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x45ae,"GGML_ASSERT(%s) failed","e > -1000");
  }
  if (999 < (int)in_ESI) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x45af,"GGML_ASSERT(%s) failed","e < 1000");
  }
  if ((int)in_ESI < 0) {
    local_c = -in_ESI;
    *in_RDI = 0x2d;
  }
  else {
    *in_RDI = 0x2b;
    local_c = in_ESI;
  }
  local_8 = in_RDI + 1;
  if (local_c < 10) {
    *local_8 = '0';
    local_8 = in_RDI + 3;
    in_RDI[2] = (char)local_c + '0';
  }
  else if (local_c < 100) {
    *local_8 = (char)((ulong)local_c / 10) + '0';
    local_8 = in_RDI + 3;
    in_RDI[2] = (char)(local_c % 10) + '0';
  }
  else {
    *local_8 = (char)((ulong)local_c / 100) + '0';
    in_RDI[2] = (char)((local_c % 100) / 10) + '0';
    local_8 = in_RDI + 4;
    in_RDI[3] = (char)((local_c % 100) % 10) + '0';
  }
  return local_8;
}

Assistant:

inline char* append_exponent(char* buf, int e)
{
    JSON_ASSERT(e > -1000);
    JSON_ASSERT(e <  1000);

    if (e < 0)
    {
        e = -e;
        *buf++ = '-';
    }
    else
    {
        *buf++ = '+';
    }

    auto k = static_cast<std::uint32_t>(e);
    if (k < 10)
    {
        // Always print at least two digits in the exponent.
        // This is for compatibility with printf("%g").
        *buf++ = '0';
        *buf++ = static_cast<char>('0' + k);
    }
    else if (k < 100)
    {
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }
    else
    {
        *buf++ = static_cast<char>('0' + k / 100);
        k %= 100;
        *buf++ = static_cast<char>('0' + k / 10);
        k %= 10;
        *buf++ = static_cast<char>('0' + k);
    }

    return buf;
}